

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<const_char_*,_Catch::Matchers::Impl::MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::MatchExpr(MatchExpr<const_char_*,_Catch::Matchers::Impl::MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,char **arg,
           MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *matcher,StringRef *matcherString)

{
  char *pcVar1;
  int iVar2;
  allocator local_49;
  string local_48 [32];
  StringRef *local_28;
  StringRef *matcherString_local;
  MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher_local;
  char **arg_local;
  MatchExpr<const_char_*,_Catch::Matchers::Impl::MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  pcVar1 = *arg;
  local_28 = matcherString;
  matcherString_local = (StringRef *)matcher;
  matcher_local =
       (MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)arg;
  arg_local = (char **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  iVar2 = (*(matcher->
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,local_48);
  ITransientExpression::ITransientExpression
            (&this->super_ITransientExpression,true,(bool)((byte)iVar2 & 1));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_003d1898;
  this->m_arg = (char **)matcher_local;
  Matchers::Impl::
  MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  MatchNotOf(&this->m_matcher,
             (MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)matcherString_local);
  (this->m_matcherString).m_start = local_28->m_start;
  (this->m_matcherString).m_size = local_28->m_size;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}